

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_format_specs(format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *this,int id,char *begin,char *end)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  handle h;
  handle handle;
  basic_string_view<char> value;
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> custom;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  custom_00;
  bool bVar3;
  type tVar4;
  char *in_RCX;
  char *in_RDX;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *in_RDI;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  format_arg arg;
  arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *in_stack_fffffffffffffc38;
  undefined2 in_stack_fffffffffffffc40;
  undefined2 in_stack_fffffffffffffc42;
  type in_stack_fffffffffffffc44;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
  *in_stack_fffffffffffffc50;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *in_stack_fffffffffffffc58;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *this_00;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *in_stack_fffffffffffffc60;
  context_type *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  float in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *in_stack_fffffffffffffc80;
  undefined2 uVar5;
  undefined6 uStack_376;
  format_specs *in_stack_fffffffffffffca8;
  custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *this_01;
  undefined4 in_stack_fffffffffffffcb0;
  uint in_stack_fffffffffffffcb4;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *parse_ctx;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffcb8;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  local_330 [2];
  buffer<char> *local_300;
  undefined1 in_stack_fffffffffffffd20 [16];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffd48;
  custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_2a8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_298;
  uint local_288;
  char *local_270;
  char *local_268;
  char *local_250;
  handle local_238;
  basic_string_view<char> local_228 [3];
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_1f8;
  custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_1f0;
  handle local_1d8;
  basic_string_view<char> local_1c8 [3];
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_190;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *local_188;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_180;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_170;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *local_160;
  buffer<char> *local_158;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_148;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *local_138;
  buffer<char> *local_130;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_120;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *local_110;
  buffer<char> *local_108;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_f8;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *local_e8;
  buffer<char> *local_e0;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_c0;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *local_90;
  buffer<char> *local_70;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_50;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *local_20;
  buffer<char> *local_8;
  
  local_270 = in_RCX;
  local_268 = in_RDX;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
             in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
  tVar4 = basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::type((basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&local_298.string);
  if (tVar4 == custom_type) {
    parse_ctx = (basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)&in_RDI->locale_
    ;
    advance_to<char,fmt::v7::detail::error_handler>
              ((basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)
               in_stack_fffffffffffffc50,
               (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    this_01 = &local_2a8;
    custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
    custom_formatter(this_01,parse_ctx,
                     (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                     &in_RDI[1].locale_);
    local_1f8 = &local_298;
    local_1f0 = this_01;
    switch(local_288) {
    case 0:
    default:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01);
      break;
    case 1:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,local_298.int_value);
      break;
    case 2:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,local_298.uint_value);
      break;
    case 3:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,CONCAT44(local_298.long_long_value._4_4_,local_298.int_value));
      break;
    case 4:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,CONCAT44(local_298.long_long_value._4_4_,local_298.int_value));
      break;
    case 5:
      auVar1._8_2_ = in_stack_fffffffffffffc40;
      auVar1._0_8_ = in_stack_fffffffffffffc38;
      auVar1._10_2_ = in_stack_fffffffffffffc42;
      auVar1._12_4_ = in_stack_fffffffffffffc44;
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,(__int128)auVar1);
      break;
    case 6:
      auVar2._8_2_ = in_stack_fffffffffffffc40;
      auVar2._0_8_ = in_stack_fffffffffffffc38;
      auVar2._10_2_ = in_stack_fffffffffffffc42;
      auVar2._12_4_ = in_stack_fffffffffffffc44;
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,(unsigned___int128)auVar2);
      break;
    case 7:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,(bool)(local_298.char_value & 1));
      break;
    case 8:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,local_298.char_value);
      break;
    case 9:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,local_298.float_value);
      break;
    case 10:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,(double)CONCAT44(local_298.long_long_value._4_4_,local_298.int_value));
      break;
    case 0xb:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,
                 (longdouble)
                 CONCAT28(local_298.int128_value._8_2_,
                          CONCAT44(local_298.long_long_value._4_4_,local_298.int_value)));
      break;
    case 0xc:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,(char *)CONCAT44(local_298.long_long_value._4_4_,local_298.int_value));
      break;
    case 0xd:
      basic_string_view<char>::basic_string_view
                (local_228,(char *)CONCAT44(local_298.long_long_value._4_4_,local_298.int_value),
                 CONCAT62(local_298.int128_value._10_6_,local_298.int128_value._8_2_));
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,local_228[0]);
      break;
    case 0xe:
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
      operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  *)this_01,(void *)CONCAT44(local_298.long_long_value._4_4_,local_298.int_value));
      break;
    case 0xf:
      custom.value._4_4_ = local_298.long_long_value._4_4_;
      custom.value._0_4_ = local_298.int_value;
      custom.format._0_2_ = local_298.int128_value._8_2_;
      custom.format._2_6_ = local_298.int128_value._10_6_;
      basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::handle::handle(&local_238,custom);
      h.custom_.format._0_2_ = in_stack_fffffffffffffc40;
      h.custom_.value = in_stack_fffffffffffffc38;
      h.custom_.format._2_2_ = in_stack_fffffffffffffc42;
      h.custom_.format._4_4_ = in_stack_fffffffffffffc44;
      custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::operator()((custom_formatter<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x286a7b,h);
    }
    local_250 = basic_format_parse_context<char,_fmt::v7::detail::error_handler>::begin
                          ((basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)
                           0x286a9b);
  }
  else {
    basic_format_specs<char>::basic_format_specs((basic_format_specs<char> *)0x286ab5);
    if (((local_268 + 1 < local_270) && (local_268[1] == '}')) &&
       (bVar3 = is_ascii_letter<char>(*local_268), bVar3)) {
      local_268 = local_268 + 1;
    }
    else {
      specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::specs_handler(&in_stack_fffffffffffffc50->
                       super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      ,(basic_format_specs<char> *)
                       CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                      (basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)
                      CONCAT44(in_stack_fffffffffffffc44,
                               CONCAT22(in_stack_fffffffffffffc42,in_stack_fffffffffffffc40)),
                      (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                      in_stack_fffffffffffffc38);
      basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::type((basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&local_298.string);
      specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
      ::specs_checker(in_stack_fffffffffffffc50,
                      (specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                      in_stack_fffffffffffffc44);
      local_268 = parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                             (char *)CONCAT44(in_stack_fffffffffffffc44,
                                              CONCAT22(in_stack_fffffffffffffc42,
                                                       in_stack_fffffffffffffc40)),
                             (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                              *)in_stack_fffffffffffffc38);
      if ((local_268 == local_270) || (*local_268 != '}')) {
        error_handler::on_error
                  ((error_handler *)in_stack_fffffffffffffc50,
                   (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      }
    }
    uVar5 = SUB82(&in_RDI[1].locale_,0);
    uStack_376 = (undefined6)((ulong)&in_RDI[1].locale_ >> 0x10);
    this_00 = local_330;
    arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::arg_formatter
              ((arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *)
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (format_specs *)in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
    local_190 = &local_298;
    local_188 = this_00;
    switch((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
            *)(ulong)local_288) {
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x0:
    default:
      local_180.container =
           (buffer<char> *)
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()(this_00);
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x1:
      local_160 = this_00;
      if (local_330[0].specs_ == (format_specs *)0x0) {
        local_170.container =
             (buffer<char> *)
             write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                       (in_stack_fffffffffffffcb8.container,in_stack_fffffffffffffcb4);
        (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             local_170.container;
      }
      else {
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<int>(this_00,in_stack_fffffffffffffc7c,
                         (format_specs *)
                         CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      }
      local_180.container =
           (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_158 = local_180.container;
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x2:
      local_138 = this_00;
      if (local_330[0].specs_ == (format_specs *)0x0) {
        local_148.container =
             (buffer<char> *)
             write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                       (in_stack_fffffffffffffcb8.container,in_stack_fffffffffffffcb4);
        (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             local_148.container;
      }
      else {
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_int>
                  (in_stack_fffffffffffffc80,(uint)((ulong)this_00 >> 0x20),
                   (format_specs *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      }
      local_180.container =
           (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_130 = local_180.container;
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x3:
      local_110 = this_00;
      if (local_330[0].specs_ == (format_specs *)0x0) {
        local_120.container =
             (buffer<char> *)
             write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                       (in_stack_fffffffffffffcb8.container,
                        CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             local_120.container;
      }
      else {
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<long_long>
                  (in_stack_fffffffffffffc80,
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                   (format_specs *)this_00);
      }
      local_180.container =
           (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_108 = local_180.container;
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x4:
      local_e8 = this_00;
      if (local_330[0].specs_ == (format_specs *)0x0) {
        local_f8.container =
             (buffer<char> *)
             write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                       (in_stack_fffffffffffffcb8.container,
                        CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             local_f8.container;
      }
      else {
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_long_long>
                  (in_stack_fffffffffffffc80,
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                   (format_specs *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      }
      local_180.container =
           (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_e0 = local_180.container;
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x5:
      local_90 = this_00;
      if (local_330[0].specs_ == (format_specs *)0x0) {
        local_c0.container =
             (buffer<char> *)
             write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                       (in_stack_fffffffffffffd48.container,(__int128)in_stack_fffffffffffffd20);
        (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             local_c0.container;
      }
      else {
        value_00._4_4_ = in_stack_fffffffffffffcb4;
        value_00._0_4_ = in_stack_fffffffffffffcb0;
        value_00._8_8_ = in_stack_fffffffffffffcb8.container;
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<__int128>(in_RDI,(__int128)value_00,in_stack_fffffffffffffca8);
      }
      local_180.container =
           (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_70 = local_180.container;
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x6:
      local_20 = this_00;
      if (local_330[0].specs_ == (format_specs *)0x0) {
        local_50.container =
             (buffer<char> *)
             write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                       (in_stack_fffffffffffffd48.container,
                        (unsigned___int128)in_stack_fffffffffffffd20);
        (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             local_50.container;
      }
      else {
        value_01._4_4_ = in_stack_fffffffffffffcb4;
        value_01._0_4_ = in_stack_fffffffffffffcb0;
        value_01._8_8_ = in_stack_fffffffffffffcb8.container;
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
        ::write_int<unsigned__int128>(in_RDI,(unsigned___int128)value_01,in_stack_fffffffffffffca8);
      }
      local_180.container =
           (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_8 = local_180.container;
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x7:
      local_180.container =
           (buffer<char> *)
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         *)in_stack_fffffffffffffc50,
                        SUB41((uint)in_stack_fffffffffffffc4c >> 0x18,0));
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x8:
      local_180.container =
           (buffer<char> *)
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()(in_stack_fffffffffffffc58,(char)((ulong)in_stack_fffffffffffffc50 >> 0x38));
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0x9:
      local_180.container =
           (buffer<char> *)
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()<float,_0>
                     ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                       *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                      in_stack_fffffffffffffc74);
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0xa:
      local_180.container =
           (buffer<char> *)
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()<double,_0>
                     ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                       *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                      (double)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0xb:
      local_180.container =
           (buffer<char> *)
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()<long_double,_0>
                     ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                       *)(ulong)local_288,(longdouble)CONCAT28(uVar5,in_stack_fffffffffffffc80));
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0xc:
      local_180.container =
           (buffer<char> *)
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0xd:
      basic_string_view<char>::basic_string_view
                (local_1c8,(char *)CONCAT44(local_298.long_long_value._4_4_,local_298.int_value),
                 CONCAT62(local_298.int128_value._10_6_,local_298.int128_value._8_2_));
      value.data_._4_4_ = in_stack_fffffffffffffc74;
      value.data_._0_4_ = in_stack_fffffffffffffc70;
      value.size_._0_4_ = in_stack_fffffffffffffc78;
      value.size_._4_4_ = in_stack_fffffffffffffc7c;
      local_180.container =
           (buffer<char> *)
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         *)in_stack_fffffffffffffc68,value);
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0xe:
      local_180.container =
           (buffer<char> *)
           arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                        (void *)CONCAT44(in_stack_fffffffffffffc44,
                                         CONCAT22(in_stack_fffffffffffffc42,
                                                  in_stack_fffffffffffffc40)));
      break;
    case (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
          *)0xf:
      custom_00.value._4_4_ = local_298.long_long_value._4_4_;
      custom_00.value._0_4_ = local_298.int_value;
      custom_00.format._0_2_ = local_298.int128_value._8_2_;
      custom_00.format._2_6_ = local_298.int128_value._10_6_;
      basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::handle::handle(&local_1d8,custom_00);
      handle.custom_.value._2_2_ = in_stack_fffffffffffffc42;
      handle.custom_.value._0_2_ = in_stack_fffffffffffffc40;
      handle.custom_.value._4_4_ = in_stack_fffffffffffffc44;
      handle.custom_.format._0_4_ = (int)this_00;
      handle.custom_.format._4_4_ = (int)((ulong)this_00 >> 0x20);
      local_180.container =
           (buffer<char> *)
           arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                     (in_stack_fffffffffffffc38,handle);
    }
    local_300 = local_180.container;
    basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::advance_to
              ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
               CONCAT62(uStack_376,uVar5),(iterator)local_180.container);
    local_250 = local_268;
  }
  return local_250;
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    auto arg = get_arg(context, id);
    if (arg.type() == type::custom_type) {
      advance_to(parse_context, begin);
      visit_format_arg(custom_formatter<Context>(parse_context, context), arg);
      return parse_context.begin();
    }
    auto specs = basic_format_specs<Char>();
    if (begin + 1 < end && begin[1] == '}' && is_ascii_letter(*begin)) {
      specs.type = static_cast<char>(*begin++);
    } else {
      using parse_context_t = basic_format_parse_context<Char>;
      specs_checker<specs_handler<parse_context_t, Context>> handler(
          specs_handler<parse_context_t, Context>(specs, parse_context,
                                                  context),
          arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
    }
    context.advance_to(visit_format_arg(
        arg_formatter<OutputIt, Char>(context, &parse_context, &specs), arg));
    return begin;
  }